

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

void __thiscall
ncnn::Mat::to_pixels_resize
          (Mat *this,uchar *pixels,int type,int target_width,int target_height,int target_stride)

{
  int _w;
  int _h;
  uint uVar1;
  int *piVar2;
  Mat src;
  
  _w = this->w;
  _h = this->h;
  if (_h == target_height && _w == target_width) {
    to_pixels(this,pixels,type);
    return;
  }
  uVar1 = type & 0xffff;
  if (0xffff < (uint)type) {
    uVar1 = type >> 0x10;
  }
  if (uVar1 - 1 < 2) {
    src.cstep = 0;
    src.data = (void *)0x0;
    src.refcount._0_4_ = 0;
    src.refcount._4_4_ = 0;
    src.elemsize._0_4_ = 0;
    src._20_8_ = 0;
    src.allocator = (Allocator *)0x0;
    src.dims = 0;
    src.w = 0;
    src.h = 0;
    src.d = 0;
    src.c = 0;
    create(&src,_w,_h,3,3,(Allocator *)0x0);
    to_pixels(this,(uchar *)src.data,type);
    resize_bilinear_c3((uchar *)src.data,this->w,this->h,this->w * 3,pixels,target_width,
                       target_height,target_stride);
    piVar2 = (int *)CONCAT44(src.refcount._4_4_,src.refcount._0_4_);
    if (piVar2 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) {
      return;
    }
    if (src.allocator != (Allocator *)0x0) {
      (*(src.allocator)->_vptr_Allocator[3])();
      return;
    }
  }
  else if (uVar1 == 3) {
    src.cstep = 0;
    src.data = (void *)0x0;
    src.refcount._0_4_ = 0;
    src.refcount._4_4_ = 0;
    src.elemsize._0_4_ = 0;
    src._20_8_ = 0;
    src.allocator = (Allocator *)0x0;
    src.dims = 0;
    src.w = 0;
    src.h = 0;
    src.d = 0;
    src.c = 0;
    create(&src,_w,_h,1,1,(Allocator *)0x0);
    to_pixels(this,(uchar *)src.data,type);
    resize_bilinear_c1((uchar *)src.data,this->w,this->h,this->w,pixels,target_width,target_height,
                       target_stride);
    piVar2 = (int *)CONCAT44(src.refcount._4_4_,src.refcount._0_4_);
    if (piVar2 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) {
      return;
    }
    if (src.allocator != (Allocator *)0x0) {
      (*(src.allocator)->_vptr_Allocator[3])();
      return;
    }
  }
  else {
    if ((uVar1 & 0xfffffffe) != 4) {
      return;
    }
    src.cstep = 0;
    src.data = (void *)0x0;
    src.refcount._0_4_ = 0;
    src.refcount._4_4_ = 0;
    src.elemsize._0_4_ = 0;
    src._20_8_ = 0;
    src.allocator = (Allocator *)0x0;
    src.dims = 0;
    src.w = 0;
    src.h = 0;
    src.d = 0;
    src.c = 0;
    create(&src,_w,_h,4,4,(Allocator *)0x0);
    to_pixels(this,(uchar *)src.data,type);
    resize_bilinear_c4((uchar *)src.data,this->w,this->h,this->w * 4,pixels,target_width,
                       target_height,target_stride);
    piVar2 = (int *)CONCAT44(src.refcount._4_4_,src.refcount._0_4_);
    if (piVar2 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) {
      return;
    }
    if (src.allocator != (Allocator *)0x0) {
      (*(src.allocator)->_vptr_Allocator[3])();
      return;
    }
  }
  if (src.data != (void *)0x0) {
    src.allocator = (Allocator *)0x0;
    free(src.data);
  }
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height, int target_stride) const
{
    if (w == target_width && h == target_height)
        return to_pixels(pixels, type);

    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        Mat src(w, h, (size_t)3u, 3);

        to_pixels(src, type);

        resize_bilinear_c3(src, w, h, w * 3, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_GRAY)
    {
        Mat src(w, h, (size_t)1u, 1);

        to_pixels(src, type);

        resize_bilinear_c1(src, w, h, w * 1, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_RGBA || type_to == PIXEL_BGRA)
    {
        Mat src(w, h, (size_t)4u, 4);

        to_pixels(src, type);

        resize_bilinear_c4(src, w, h, w * 4, pixels, target_width, target_height, target_stride);
    }
}